

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

void __thiscall ot::commissioner::coap::Message::SetToken(Message *this,uint8_t aTokenLength)

{
  if (aTokenLength < 9) {
    *(byte *)&this->mHeader = *(byte *)&this->mHeader & 0xf | aTokenLength << 4;
    random::non_crypto::FillBuffer((this->mHeader).mToken,(ushort)aTokenLength);
    return;
  }
  abort();
}

Assistant:

void Message::SetToken(uint8_t aTokenLength)
{
    VerifyOrDie(aTokenLength <= sizeof(mHeader.mToken));

    mHeader.mTokenLength = aTokenLength;
    random::non_crypto::FillBuffer(mHeader.mToken, aTokenLength);
}